

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

int ixxx::posix::mkdir(char *__path,__mode_t __mode)

{
  int iVar1;
  mkdir_error *this;
  int *piVar2;
  
  iVar1 = ::mkdir(__path,__mode);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (mkdir_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  mkdir_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&mkdir_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void mkdir(const char *pathname, mode_t mode)
    {
#if (defined(__MINGW32__) || defined(__MINGW64__))
      int r = ::mkdir(pathname);
#else
      int r = ::mkdir(pathname, mode);
#endif
      if (r == -1)
        throw mkdir_error(errno);
    }